

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

int CBB_add_asn1_int64_with_tag(CBB *cbb,int64_t value,CBS_ASN1_TAG tag)

{
  int iVar1;
  bool bVar2;
  int local_64;
  undefined1 local_60 [4];
  int i;
  CBB child;
  int start;
  uint8_t bytes [8];
  CBS_ASN1_TAG tag_local;
  int64_t value_local;
  CBB *cbb_local;
  
  if (value < 0) {
    stack0xffffffffffffffd4 = value;
    child.u._24_4_ = 7;
    while( true ) {
      bVar2 = false;
      if ((0 < (int)child.u._24_4_) &&
         (bVar2 = false, *(char *)((long)&child.u + (long)(int)child.u._24_4_ + 0x1c) == -1)) {
        bVar2 = (*(byte *)((long)&child.u + (long)(child.u._24_4_ + -1) + 0x1c) & 0x80) != 0;
      }
      if (!bVar2) break;
      child.u._24_4_ = child.u._24_4_ + -1;
    }
    iVar1 = CBB_add_asn1(cbb,(CBB *)local_60,tag);
    if (iVar1 == 0) {
LAB_003b233e:
      cbb_on_error(cbb);
      cbb_local._4_4_ = 0;
    }
    else {
      for (local_64 = child.u._24_4_; -1 < local_64; local_64 = local_64 + -1) {
        iVar1 = CBB_add_u8((CBB *)local_60,*(uint8_t *)((long)&child.u + (long)local_64 + 0x1c));
        if (iVar1 == 0) goto LAB_003b233e;
      }
      cbb_local._4_4_ = CBB_flush(cbb);
    }
  }
  else {
    cbb_local._4_4_ = CBB_add_asn1_uint64_with_tag(cbb,value,tag);
  }
  return cbb_local._4_4_;
}

Assistant:

int CBB_add_asn1_int64_with_tag(CBB *cbb, int64_t value, CBS_ASN1_TAG tag) {
  if (value >= 0) {
    return CBB_add_asn1_uint64_with_tag(cbb, (uint64_t)value, tag);
  }

  uint8_t bytes[sizeof(int64_t)];
  memcpy(bytes, &value, sizeof(value));
  int start = 7;
  // Skip leading sign-extension bytes unless they are necessary.
  while (start > 0 && (bytes[start] == 0xff && (bytes[start - 1] & 0x80))) {
    start--;
  }

  CBB child;
  if (!CBB_add_asn1(cbb, &child, tag)) {
    goto err;
  }
  for (int i = start; i >= 0; i--) {
    if (!CBB_add_u8(&child, bytes[i])) {
      goto err;
    }
  }
  return CBB_flush(cbb);

err:
  cbb_on_error(cbb);
  return 0;
}